

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::AttachmentPromiseNode<kj::_::Deferred<kj::Function<void_()>_>_>::AttachmentPromiseNode
          (AttachmentPromiseNode<kj::_::Deferred<kj::Function<void_()>_>_> *this,
          OwnPromiseNode *dependency,Deferred<kj::Function<void_()>_> *attachment)

{
  AttachmentPromiseNodeBase::AttachmentPromiseNodeBase
            (&this->super_AttachmentPromiseNodeBase,dependency);
  (this->super_AttachmentPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_00643a48;
  Maybe<kj::Function<void_()>_>::Maybe(&(this->attachment).maybeFunc,&attachment->maybeFunc);
  return;
}

Assistant:

AttachmentPromiseNode(OwnPromiseNode&& dependency, Attachment&& attachment)
      : AttachmentPromiseNodeBase(kj::mv(dependency)),
        attachment(kj::mv<Attachment>(attachment)) {}